

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

lbool __thiscall Minisat::SimpSolver::solve_(SimpSolver *this,bool do_simp,bool turn_off_simp)

{
  bool bVar1;
  char *pcVar2;
  undefined7 in_register_00000011;
  byte bVar3;
  long lVar5;
  undefined7 in_register_00000031;
  int i;
  lbool result;
  Var v;
  uint local_50;
  undefined4 local_4c;
  vec<int,_int> extra_frozen;
  ulong uVar4;
  
  uVar4 = CONCAT71(in_register_00000031,do_simp) & 0xffffffff;
  extra_frozen.data = (int *)0x0;
  extra_frozen.sz = 0;
  extra_frozen.cap = 0;
  result.value = l_True.value;
  bVar3 = (byte)uVar4 & this->use_simplification;
  uVar4 = CONCAT71((int7)(uVar4 >> 8),bVar3);
  if (bVar3 == 1) {
    local_4c = (undefined4)CONCAT71(in_register_00000011,turn_off_simp);
    local_50 = (uint)uVar4;
    for (lVar5 = 0; lVar5 < (this->super_Solver).assumptions.sz; lVar5 = lVar5 + 1) {
      v = (this->super_Solver).assumptions.data[lVar5].x >> 1;
      bVar1 = isEliminated(this,v);
      if (bVar1) {
        __assert_fail("!isEliminated(v)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/simp/SimpSolver.cc"
                      ,0x77,"lbool Minisat::SimpSolver::solve_(bool, bool)");
      }
      pcVar2 = IntMap<int,_char,_Minisat::MkIndexDefault<int>_>::operator[]
                         (&(this->frozen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>,v);
      if (*pcVar2 == '\0') {
        setFrozen(this,v,true);
        vec<int,_int>::push(&extra_frozen,&v);
      }
    }
    bVar1 = eliminate(this,local_4c._0_1_);
    result.value = !bVar1;
    uVar4 = (ulong)local_50;
  }
  bVar1 = lbool::operator==(&result,l_True);
  if (bVar1) {
    result = Solver::solve_(&this->super_Solver);
  }
  else if (0 < (this->super_Solver).verbosity) {
    puts("===============================================================================");
  }
  bVar1 = lbool::operator==(&result,l_True);
  if ((bVar1) && (this->extend_model == true)) {
    extendModel(this);
  }
  if ((char)uVar4 != '\0') {
    for (lVar5 = 0; lVar5 < extra_frozen.sz; lVar5 = lVar5 + 1) {
      setFrozen(this,extra_frozen.data[lVar5],false);
    }
  }
  vec<int,_int>::~vec(&extra_frozen);
  return (lbool)result.value;
}

Assistant:

lbool SimpSolver::solve_(bool do_simp, bool turn_off_simp)
{
    vec<Var> extra_frozen;
    lbool    result = l_True;

    do_simp &= use_simplification;

    if (do_simp){
        // Assumptions must be temporarily frozen to run variable elimination:
        for (int i = 0; i < assumptions.size(); i++){
            Var v = var(assumptions[i]);

            // If an assumption has been eliminated, remember it.
            assert(!isEliminated(v));

            if (!frozen[v]){
                // Freeze and store.
                setFrozen(v, true);
                extra_frozen.push(v);
            } }

        result = lbool(eliminate(turn_off_simp));
    }

    if (result == l_True)
        result = Solver::solve_();
    else if (verbosity >= 1)
        printf("===============================================================================\n");

    if (result == l_True && extend_model)
        extendModel();

    if (do_simp)
        // Unfreeze the assumptions that were frozen:
        for (int i = 0; i < extra_frozen.size(); i++)
            setFrozen(extra_frozen[i], false);

    return result;
}